

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader.c
# Opt level: O3

void emit_ARB1_finalize(Context *ctx)

{
  int iVar1;
  MOJOSHADER_shaderType MVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  ulong uVar7;
  char *pcVar8;
  char buf [64];
  char acStack_78 [72];
  
  push_output(ctx,&ctx->preflight);
  MVar2 = ctx->shader_type;
  if (MVar2 == MOJOSHADER_TYPE_VERTEX) {
    if (ctx->arb1_wrote_position != 0) goto LAB_0010d2e0;
    output_line(ctx,"OPTION ARB_position_invariant;");
    MVar2 = ctx->shader_type;
  }
  if ((MVar2 == MOJOSHADER_TYPE_PIXEL) && (ctx->have_multi_color_outputs != 0)) {
    output_line(ctx,"OPTION ARB_draw_buffers;");
  }
LAB_0010d2e0:
  if (0 < ctx->output_stack_len) {
    uVar3 = ctx->output_stack_len - 1;
    ctx->output_stack_len = uVar3;
    ctx->output = ctx->output_stack[uVar3];
    ctx->indent = ctx->indent_stack[uVar3];
    pcVar8 = "FLOAT TEMP";
    if (ctx->profile_supports_nv4 == 0) {
      pcVar8 = "TEMP";
    }
    push_output(ctx,&ctx->globals);
    iVar4 = ctx->max_scratch_registers;
    if (0 < iVar4) {
      iVar6 = 0;
      do {
        iVar1 = ctx->scratch_registers;
        iVar5 = iVar1 + 1;
        ctx->scratch_registers = iVar5;
        if (iVar4 <= iVar1) {
          ctx->max_scratch_registers = iVar5;
        }
        snprintf(acStack_78,0x40,"scratch%d");
        output_line(ctx,"%s %s;",pcVar8,acStack_78);
        iVar6 = iVar6 + 1;
        iVar4 = ctx->max_scratch_registers;
      } while (iVar6 < iVar4);
    }
    if ((((ctx->profile_supports_nv2 != 0) && (ctx->shader_type != MOJOSHADER_TYPE_PIXEL)) &&
        (ctx->profile_supports_nv4 == 0)) && (0 < ctx->max_reps)) {
      uVar7 = 0;
      do {
        output_line(ctx,"TEMP rep%d;",uVar7);
        uVar3 = (int)uVar7 + 1;
        uVar7 = (ulong)uVar3;
      } while ((int)uVar3 < ctx->max_reps);
    }
    if (0 < ctx->output_stack_len) {
      uVar3 = ctx->output_stack_len - 1;
      ctx->output_stack_len = uVar3;
      ctx->output = ctx->output_stack[uVar3];
      ctx->indent = ctx->indent_stack[uVar3];
      if (ctx->scratch_registers == ctx->max_scratch_registers) {
        return;
      }
      __assert_fail("ctx->scratch_registers == ctx->max_scratch_registers",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader.c"
                    ,0x1b38,"void emit_ARB1_finalize(Context *)");
    }
  }
  __assert_fail("ctx->output_stack_len > 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader.c"
                ,0x173,"void pop_output(Context *)");
}

Assistant:

static void emit_ARB1_finalize(Context *ctx)
{
    push_output(ctx, &ctx->preflight);

    if (shader_is_vertex(ctx) && !ctx->arb1_wrote_position)
        output_line(ctx, "OPTION ARB_position_invariant;");

    if (shader_is_pixel(ctx) && ctx->have_multi_color_outputs)
        output_line(ctx, "OPTION ARB_draw_buffers;");

    pop_output(ctx);

    const char *tmpstr = arb1_float_temp(ctx);
    int i;
    push_output(ctx, &ctx->globals);
    for (i = 0; i < ctx->max_scratch_registers; i++)
    {
        char buf[64];
        allocate_ARB1_scratch_reg_name(ctx, buf, sizeof (buf));
        output_line(ctx, "%s %s;", tmpstr, buf);
    } // for

    // nv2 fragment programs (and anything nv4) have a real REP/ENDREP.
    if ( (support_nv2(ctx)) && (!shader_is_pixel(ctx)) && (!support_nv4(ctx)) )
    {
        // set up temps for nv2 REP/ENDREP emulation through branching.
        for (i = 0; i < ctx->max_reps; i++)
            output_line(ctx, "TEMP rep%d;", i);
    } // if

    pop_output(ctx);
    assert(ctx->scratch_registers == ctx->max_scratch_registers);
}